

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O0

uint64_t __thiscall protozero::pbf_reader::get_fixed64(pbf_reader *this)

{
  bool bVar1;
  pbf_tag_type pVar2;
  assert_error *paVar3;
  unsigned_long uVar4;
  pbf_reader *this_local;
  
  pVar2 = tag(this);
  if (pVar2 == 0) {
    paVar3 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar3,"tag() != 0 && \"call next() before accessing field value\"");
    __cxa_throw(paVar3,&assert_error::typeinfo,assert_error::~assert_error);
  }
  bVar1 = has_wire_type(this,fixed64);
  if (!bVar1) {
    paVar3 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error
              (paVar3,"has_wire_type(pbf_wire_type::fixed64) && \"not a 64-bit fixed\"");
    __cxa_throw(paVar3,&assert_error::typeinfo,assert_error::~assert_error);
  }
  uVar4 = get_fixed<unsigned_long>(this);
  return uVar4;
}

Assistant:

uint64_t get_fixed64() {
        protozero_assert(tag() != 0 && "call next() before accessing field value");
        protozero_assert(has_wire_type(pbf_wire_type::fixed64) && "not a 64-bit fixed");
        return get_fixed<uint64_t>();
    }